

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

void __thiscall QPainterPath::moveTo(QPainterPath *this,QPointF *p)

{
  QList<QPainterPath::Element> *this_00;
  qreal qVar1;
  QPainterPathPrivate *pQVar2;
  bool bVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  Element local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = hasValidCoords(*p);
  if (bVar3) {
    ensureData(this);
    detach(this);
    pQVar2 = (this->d_ptr).d.ptr;
    pQVar2->field_0x84 = pQVar2->field_0x84 & 0xfe;
    this_00 = &pQVar2->elements;
    if ((pQVar2->elements).d.ptr[(pQVar2->elements).d.size + -1].type == MoveToElement) {
      qVar1 = p->xp;
      iVar4 = QList<QPainterPath::Element>::end(this_00);
      iVar4.i[-1].x = qVar1;
      qVar1 = p->yp;
      iVar4 = QList<QPainterPath::Element>::end(this_00);
      iVar4.i[-1].y = qVar1;
    }
    else {
      local_38.x = p->xp;
      local_38.y = p->yp;
      local_38.type = MoveToElement;
      local_38._20_4_ = 0xaaaaaaaa;
      QList<QPainterPath::Element>::emplaceBack<QPainterPath::Element_const&>(this_00,&local_38);
    }
    pQVar2->cStart = (int)(pQVar2->elements).d.size + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::moveTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::moveTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::moveTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());

    d->require_moveTo = false;

    if (d->elements.constLast().type == MoveToElement) {
        d->elements.last().x = p.x();
        d->elements.last().y = p.y();
    } else {
        Element elm = { p.x(), p.y(), MoveToElement };
        d->elements.append(elm);
    }
    d->cStart = d->elements.size() - 1;
}